

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O0

CharFormat testing::internal::PrintCharsAsStringTo<char>(char *begin,size_t len,ostream *os)

{
  char ch;
  long lVar1;
  bool bVar2;
  CharFormat CVar3;
  ostream *poVar4;
  long in_FS_OFFSET;
  ulong uStack_40;
  char cur;
  size_t index;
  CharFormat print_format;
  bool is_previous_hex;
  char *kQuoteBegin;
  ostream *os_local;
  size_t len_local;
  char *begin_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::operator<<(os,"\"");
  bVar2 = false;
  index._0_4_ = kAsIs;
  for (uStack_40 = 0; uStack_40 < len; uStack_40 = uStack_40 + 1) {
    ch = begin[uStack_40];
    if ((bVar2) && (bVar2 = IsXDigit(ch), bVar2)) {
      poVar4 = std::operator<<(os,"\" ");
      std::operator<<(poVar4,"\"");
    }
    CVar3 = PrintAsStringLiteralTo(ch,os);
    bVar2 = CVar3 == kHexEscape;
    if (bVar2) {
      index._0_4_ = kHexEscape;
    }
  }
  std::operator<<(os,"\"");
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (CharFormat)index;
}

Assistant:

static CharFormat PrintCharsAsStringTo(
    const CharType* begin, size_t len, ostream* os) {
  const char* const kQuoteBegin = sizeof(CharType) == 1 ? "\"" : "L\"";
  *os << kQuoteBegin;
  bool is_previous_hex = false;
  CharFormat print_format = kAsIs;
  for (size_t index = 0; index < len; ++index) {
    const CharType cur = begin[index];
    if (is_previous_hex && IsXDigit(cur)) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" " << kQuoteBegin;
    }
    is_previous_hex = PrintAsStringLiteralTo(cur, os) == kHexEscape;
    // Remember if any characters required hex escaping.
    if (is_previous_hex) {
      print_format = kHexEscape;
    }
  }
  *os << "\"";
  return print_format;
}